

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgraph_class_emu_d3d56.cc
# Opt level: O3

void __thiscall hwtest::pgraph::MthdEmuD3D56TexFormat::emulate_mthd(MthdEmuD3D56TexFormat *this)

{
  pgraph_state *state;
  byte *pbVar1;
  uint32_t uVar2;
  int iVar3;
  bool bVar4;
  uint uVar5;
  uint uVar6;
  bool bVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  int iVar11;
  long lVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  uint uVar16;
  uint32_t *puVar17;
  
  state = &(this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp;
  pgraph_celsius_pre_icmd(state);
  uVar5 = (this->super_SingleMthdTest).super_MthdTest.val;
  uVar13 = uVar5 >> 0x1c & 7;
  uVar14 = uVar5 >> 0x18 & 7;
  if (uVar14 == 0) {
    uVar15 = (uint)((this->super_SingleMthdTest).super_MthdTest.super_StateTest.super_RepeatTest.
                    super_Test.chipset.chipset < 0x11) << 0x18 | uVar5 & 0xf0fff002 | 0x2000000;
  }
  else {
    uVar15 = uVar5 & 0xf0fff002 | 0x2000000;
    if (uVar14 != 2) {
      uVar15 = uVar5;
    }
    uVar16 = uVar5 & 0xfffff002;
    if (uVar14 != 1) {
      uVar16 = uVar15 & 0xf7fff002;
    }
    uVar15 = (uVar16 & 0xf8fff002) + 0x3000000;
    if (uVar14 != 4) {
      uVar15 = uVar16;
    }
    if (uVar14 == 5) {
      uVar15 = (uint)(0x10 < (this->super_SingleMthdTest).super_MthdTest.super_StateTest.
                             super_RepeatTest.super_Test.chipset.chipset) << 0x18 |
               uVar16 & 0xf8fff002;
    }
  }
  uVar6 = uVar5 >> 0xc & 0xf;
  uVar8 = uVar5 >> 0x10 & 0xf;
  uVar10 = uVar5 >> 0x14 & 0xf;
  uVar16 = uVar15 & 0xf8ffffff;
  if (uVar14 < 6) {
    uVar16 = uVar15;
  }
  if (uVar13 == 0) {
    iVar11 = (this->super_SingleMthdTest).super_MthdTest.super_StateTest.super_RepeatTest.super_Test
             .chipset.chipset;
    uVar14 = (uint)(iVar11 < 0x11) << 0x1d | uVar16 & 0xfffffff;
  }
  else {
    uVar14 = uVar16 & 0x7fffffff;
    if (uVar13 == 1) {
      uVar14 = uVar16;
    }
    iVar11 = (this->super_SingleMthdTest).super_MthdTest.super_StateTest.super_RepeatTest.super_Test
             .chipset.chipset;
  }
  uVar15 = uVar5 >> 8 & 0xf;
  uVar16 = uVar14 & 0x8fffffff;
  if (uVar13 == 7) {
    uVar14 = uVar16;
  }
  uVar9 = uVar16 + 0x30000000;
  if (uVar13 != 4) {
    uVar9 = uVar14;
  }
  uVar14 = uVar16 + 0x10000000;
  if (uVar13 != 5) {
    uVar14 = uVar9;
  }
  uVar16 = (uint)(0x10 < iVar11) << 0x1d | uVar16;
  if (uVar13 != 6) {
    uVar16 = uVar14;
  }
  uVar13 = uVar10;
  if (uVar10 < uVar8) {
    uVar13 = uVar8;
  }
  uVar13 = uVar13 + 1;
  if (uVar6 <= uVar10) {
    uVar13 = uVar6;
  }
  if (uVar6 <= uVar8) {
    uVar13 = uVar6;
  }
  uVar2 = (this->super_SingleMthdTest).super_MthdTest.cls;
  if (uVar2 == 0x54) {
    if (uVar15 != 1) goto LAB_00216a1c;
  }
  else if (uVar15 != 1 || uVar2 != 0x94) goto LAB_00216a1c;
  uVar15 = 0;
LAB_00216a1c:
  if (((this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.nsource & 2) == 0) {
    uVar14 = this->which;
    lVar12 = 0;
    bVar4 = true;
    do {
      bVar7 = bVar4;
      if ((uVar14 >> (int)lVar12 & 1) != 0) {
        (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.bundle_tex_format[lVar12] =
             (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.bundle_tex_format
             [lVar12] & 8 |
             (uVar13 << 0xc | uVar15 << 7) + (uVar5 >> 1 & 0x50 | uVar16 & 0xffff002f);
      }
      lVar12 = 1;
      bVar4 = false;
    } while (bVar7);
    uVar2 = (this->super_SingleMthdTest).super_MthdTest.cls;
    if ((uVar2 == 0x54) || (uVar2 == 0x94)) {
      uVar5 = (this->super_SingleMthdTest).super_MthdTest.val >> 2 & 3;
      (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.bundle_tex_control_a[0] =
           uVar5 + 0x4003ffc0;
      puVar17 = (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.bundle_tex_control_a
                + 1;
      (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.bundle_tex_control_a[1] =
           uVar5 | 0x3ffc0;
      uVar2 = (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.bundle_tex_format[0];
      uVar13 = (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.bundle_config_b &
               0x40;
      uVar5 = ~uVar16 >> 0x1d & 0xfffffffc;
      if ((uVar16 >> 0x1b & 1) != 0) {
        uVar5 = 0;
      }
      if (uVar13 == 0) {
        uVar5 = uVar13 >> 6;
      }
      (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.celsius_xf_misc_b =
           uVar5 | (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.celsius_xf_misc_b
                   & 0xfffefffb;
      pgraph_celsius_icmd(state,4,uVar2,false);
      pgraph_celsius_icmd(state,6,(this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.
                                  bundle_tex_control_a[0],false);
      iVar11 = 7;
    }
    else {
      iVar3 = this->which;
      if ((long)iVar3 == 2) {
        uVar13 = (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.bundle_config_b &
                 0x40;
        uVar5 = 0;
        if ((uVar16 >> 0x1b & 1) == 0) {
          uVar5 = ~uVar16 >> 0xf & 0x10000;
        }
        if (uVar13 == 0) {
          uVar5 = uVar13 >> 6;
        }
        (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.celsius_xf_misc_b =
             uVar5 | (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.
                     celsius_xf_misc_b & 0xfffeffff;
      }
      iVar11 = iVar3 + 3;
      puVar17 = (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.bundle_tex_filter +
                (long)iVar3 + 0xf;
    }
    pgraph_celsius_icmd(state,iVar11,*puVar17,true);
    uVar5 = this->which;
    uVar14 = (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.celsius_xf_misc_b;
    uVar13 = uVar5 & 1;
    if (uVar13 != 0) {
      uVar6 = (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.bundle_config_b & 0x40
      ;
      uVar15 = 0;
      if ((uVar16 >> 0x1b & 1) == 0) {
        uVar15 = ~uVar16 >> 0x1d & 0xfffffffc;
      }
      if (uVar6 == 0) {
        uVar15 = uVar6 >> 6;
      }
      uVar14 = uVar14 & 0xfffffffb | uVar15;
      (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.celsius_xf_misc_b = uVar14;
    }
    uVar15 = (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.celsius_xf_misc_a |
             0x10000000;
    (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.celsius_xf_misc_a = uVar15;
    (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.celsius_pipe_junk[2] = uVar15;
    (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.celsius_pipe_junk[3] = uVar14;
  }
  else {
    uVar5 = this->which;
    uVar13 = uVar5 & 1;
  }
  if (uVar13 != 0) {
    pbVar1 = (byte *)((long)(this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.valid +
                     5);
    *pbVar1 = *pbVar1 | 0x80;
  }
  if ((uVar5 & 2) != 0) {
    pbVar1 = (byte *)((long)(this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.valid +
                     6);
    *pbVar1 = *pbVar1 | 0x20;
  }
  return;
}

Assistant:

void emulate_mthd() override {
		pgraph_celsius_pre_icmd(&exp);
		uint32_t rval = val & 0xfffff002;
		int omips = extr(val, 12, 4);
		int sfmt = extr(val, 8, 4);
		int fmt = sfmt;
		int mips = omips;
		int su = extr(val, 16, 4);
		int sv = extr(val, 20, 4);
		int wrapu = extr(val, 24, 3);
		int wrapv = extr(val, 28, 3);
		if (wrapu == 2)
			insrt(rval, 24, 4, 2);
		if (wrapu != 1)
			insrt(rval, 27, 1, 0);
		if (wrapu == 0)
			insrt(rval, 24, 3, nv04_pgraph_is_nv15p(&chipset) ? 2 : 3);
		if (wrapu == 4)
			insrt(rval, 24, 3, 3);
		if (wrapu == 5)
			insrt(rval, 24, 3, nv04_pgraph_is_nv15p(&chipset) ? 1 : 0);
		if (wrapu > 5)
			insrt(rval, 24, 3, 0);
		if (wrapv != 1)
			insrt(rval, 31, 1, 0);
		if (wrapv == 0)
			insrt(rval, 28, 3, nv04_pgraph_is_nv15p(&chipset) ? 0 : 2);
		if (wrapv == 7)
			insrt(rval, 28, 3, 0);
		if (wrapv == 4)
			insrt(rval, 28, 3, 3);
		if (wrapv == 5)
			insrt(rval, 28, 3, 1);
		if (wrapv == 6)
			insrt(rval, 28, 3, nv04_pgraph_is_nv15p(&chipset) ? 2 : 0);
		if (mips > su && mips > sv)
			mips = (su > sv ? su : sv) + 1;
		if (cls == 0x54 || cls == 0x94) {
			if (sfmt == 1)
				fmt = 0;
		}
		insrt(rval, 4, 1, extr(val, 5, 1));
		insrt(rval, 6, 1, extr(val, 7, 1));
		insrt(rval, 7, 5, fmt);
		insrt(rval, 12, 4, mips);
		if (!extr(exp.nsource, 1, 1)) {
			for (int i = 0; i < 2; i++) {
				if (which & 1 << i) {
					exp.bundle_tex_format[i] = rval | (exp.bundle_tex_format[i] & 8);
				}
			}
			if (cls == 0x94 || cls == 0x54) {
				exp.bundle_tex_control_a[0] = 0x4003ffc0 | extr(val, 2, 2);
				exp.bundle_tex_control_a[1] = 0x3ffc0 | extr(val, 2, 2);
				insrt(exp.celsius_xf_misc_b, 2, 1,
					extr(exp.bundle_config_b, 6, 1) &&
					!extr(rval, 27, 1) && !extr(rval, 31, 1));
				insrt(exp.celsius_xf_misc_b, 16, 1, 0);
				pgraph_celsius_icmd(&exp, 4, exp.bundle_tex_format[0], false);
				pgraph_celsius_icmd(&exp, 6, exp.bundle_tex_control_a[0], false);
				pgraph_celsius_icmd(&exp, 7, exp.bundle_tex_control_a[1], true);
			} else {
				if (which == 2) {
					insrt(exp.celsius_xf_misc_b, 16, 1,
						extr(exp.bundle_config_b, 6, 1) &&
						!extr(rval, 27, 1) && !extr(rval, 31, 1));
				}
				pgraph_celsius_icmd(&exp, 4 + which - 1, exp.bundle_tex_format[which - 1], true);
			}
			if (which & 1) {
				insrt(exp.celsius_xf_misc_b, 2, 1,
					extr(exp.bundle_config_b, 6, 1) &&
					!extr(rval, 27, 1) && !extr(rval, 31, 1));
			}
			insrt(exp.celsius_xf_misc_a, 28, 1, 1);
			exp.celsius_pipe_junk[2] = exp.celsius_xf_misc_a;
			exp.celsius_pipe_junk[3] = exp.celsius_xf_misc_b;
		}
		if (which & 1)
			insrt(exp.valid[1], 15, 1, 1);
		if (which & 2)
			insrt(exp.valid[1], 21, 1, 1);
	}